

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

int macro_getargs(int ip)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ushort **ppuVar4;
  byte *pbVar5;
  long lVar6;
  size_t sVar7;
  __int32_t **pp_Var8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  char (*__s) [80];
  byte bVar17;
  int iVar18;
  char (*__s_00) [80];
  byte bVar19;
  char cVar20;
  ulong uVar21;
  bool bVar22;
  
  lVar3 = (long)midx;
  if (lVar3 == 7) {
    pcVar15 = "Too many nested macro calls!";
  }
  else {
    mcntstack[lVar3] = mcounter;
    iVar11 = midx + 1;
    midx = iVar11;
    mstack[lVar3] = mlptr;
    __s_00 = marg[iVar11];
    lVar3 = -0x2d0;
    do {
      *(undefined1 *)((long)iVar11 * 800 + 0x11fcc0 + lVar3) = 0;
      lVar3 = lVar3 + 0x50;
    } while (lVar3 != 0);
    ppuVar4 = __ctype_b_loc();
    iVar11 = 0;
LAB_0010d708:
    do {
      while( true ) {
        pcVar15 = "Unterminated string!";
        pbVar5 = (byte *)(prlnbuf + ip);
        iVar12 = ip + 1;
        iVar2 = ip + 2;
        do {
          iVar16 = ip;
          iVar18 = iVar2;
          iVar9 = iVar12;
          ip = iVar16 + 1;
          bVar19 = *pbVar5;
          uVar21 = (ulong)(char)bVar19;
          pbVar5 = pbVar5 + 1;
          iVar12 = iVar9 + 1;
          iVar2 = iVar18 + 1;
        } while ((*(byte *)((long)*ppuVar4 + uVar21 * 2 + 1) & 0x20) != 0);
        if (bVar19 < 0x3b) break;
        if (bVar19 == 0x5c) {
          pcVar15 = prlnbuf + iVar9;
          do {
            cVar20 = *pcVar15;
            pcVar15 = pcVar15 + 1;
          } while ((*(byte *)((long)*ppuVar4 + (long)cVar20 * 2 + 1) & 0x20) != 0);
          if ((cVar20 != ';') && (cVar20 != '\0')) {
LAB_0010d8b3:
            lVar3 = (long)ip;
            lVar14 = 0;
            uVar13 = 0;
            bVar1 = false;
            iVar12 = 0;
            ip = iVar16;
            do {
              cVar20 = (char)uVar21;
              uVar10 = (uint)uVar21 & 0xff;
              if (uVar10 < 0x2c) {
                if (uVar10 == 0x28) {
LAB_0010d8f3:
                  iVar12 = iVar12 + 1;
                }
                else if (uVar10 == 0x29) {
LAB_0010d8e6:
                  bVar22 = iVar12 == 0;
                  iVar12 = iVar12 + -1;
                  if (bVar22) {
                    iVar12 = 0;
                  }
                }
                else if ((uVar21 & 0xff) == 0) goto LAB_0010d96e;
              }
              else if (uVar10 < 0x5b) {
                if (uVar10 == 0x2c) {
                  if (iVar12 == 0) goto LAB_0010d96e;
                }
                else if (uVar10 == 0x3b) goto LAB_0010d96e;
              }
              else {
                if (uVar10 == 0x5b) goto LAB_0010d8f3;
                if (uVar10 == 0x5d) goto LAB_0010d8e6;
              }
              if (bVar1) {
                bVar1 = true;
                if (cVar20 != ' ') {
                  uVar10 = (uint)lVar14;
                  if ((int)uVar13 < (int)uVar10) {
                    memset(*(char (*) [80])*__s_00 + (int)uVar13,0x20,(ulong)(~uVar13 + uVar10) + 1)
                    ;
                    uVar13 = uVar10;
                  }
LAB_0010d949:
                  lVar6 = (long)(int)uVar13;
                  uVar13 = uVar13 + 1;
                  (*(char (*) [80])*__s_00)[lVar6] = cVar20;
                  bVar1 = false;
                }
              }
              else {
                bVar1 = true;
                if (cVar20 != ' ') goto LAB_0010d949;
              }
              if (uVar13 == 0x50) goto LAB_0010dad7;
              uVar21 = (ulong)(byte)prlnbuf[lVar14 + lVar3];
              lVar14 = lVar14 + 1;
              ip = ip + 1;
            } while( true );
          }
          if (pass == 1) {
            println();
            clearln();
          }
          iVar12 = readline();
          ip = 0x1a;
          if (iVar12 == -1) {
            return 0;
          }
        }
        else {
          if (bVar19 != 0x7b) {
            if (bVar19 == 0x3b) {
              return 1;
            }
            goto LAB_0010d8b3;
          }
          bVar19 = 0x7d;
LAB_0010d773:
          if (bVar19 == 0x22) {
            (*(char (*) [80])*__s_00)[0] = '\"';
          }
          uVar21 = (ulong)(bVar19 == 0x22);
          bVar17 = prlnbuf[ip];
          if (bVar17 == 0) goto LAB_0010dae7;
          pbVar5 = (byte *)(prlnbuf + iVar18);
          lVar3 = 0;
          while( true ) {
            lVar14 = uVar21 + lVar3;
            if (lVar14 == 0x50) {
              pcVar15 = "String too long, max. 80 characters!";
              goto LAB_0010dae7;
            }
            if (bVar17 == bVar19) break;
            (*(char (*) [80])*__s_00)[lVar3 + uVar21] = bVar17;
            bVar17 = prlnbuf[lVar3 + iVar12];
            lVar3 = lVar3 + 1;
            iVar9 = iVar9 + 1;
            pbVar5 = pbVar5 + 1;
            if (bVar17 == 0) goto LAB_0010dae7;
          }
          if (bVar19 == 0x22) {
            lVar14 = uVar21 + lVar3 + 1;
            (*(char (*) [80])*__s_00)[uVar21 + lVar3] = bVar17;
          }
          do {
            bVar19 = *pbVar5;
            iVar9 = iVar9 + 1;
            pbVar5 = pbVar5 + 1;
          } while ((*(byte *)((long)*ppuVar4 + (long)(char)bVar19 * 2 + 1) & 0x20) != 0);
          if ((0x3b < bVar19) || ((0x800100000000001U >> ((ulong)(uint)bVar19 & 0x3f) & 1) == 0)) {
            pcVar15 = "Syntax error!";
            goto LAB_0010dae7;
          }
          (*(char (*) [80])*__s_00)[(int)lVar14] = '\0';
          ip = iVar9;
        }
      }
      if (bVar19 == 0x22) goto LAB_0010d773;
      if (bVar19 == 0) {
        return 1;
      }
      if (bVar19 != 0x2c) goto LAB_0010d8b3;
      iVar11 = iVar11 + 1;
      __s_00 = marg[midx] + iVar11;
    } while (iVar11 != 9);
    pcVar15 = "Too many arguments for a macro!";
  }
LAB_0010dae7:
  error(pcVar15);
  return 0;
LAB_0010d96e:
  (*(char (*) [80])*__s_00)[(int)uVar13] = '\0';
  sVar7 = strlen(*__s_00);
  if (((sVar7 != 0 && iVar11 != 0) &&
      (pp_Var8 = __ctype_tolower_loc(), ((*pp_Var8)[(*(char (*) [80])*__s_00)[0]] & 0xfeU) == 0x78))
     && ((iVar12 = strcasecmp(*__s_00,"x++"), iVar12 == 0 ||
         ((iVar12 = strcasecmp(*__s_00,"y++"), sVar7 == 1 || (iVar12 == 0)))))) {
    lVar3 = (long)midx;
    __s = marg[lVar3] + (iVar11 + -1);
    sVar7 = strlen(*__s);
    if (0x4b < sVar7) {
LAB_0010dad7:
      pcVar15 = "Macro argument string too long, max. 80 characters!";
      goto LAB_0010dae7;
    }
    sVar7 = strlen(*__s);
    (*__s + sVar7)[0] = ',';
    (*__s + sVar7)[1] = '\0';
    __s_00 = marg[lVar3] + iVar11;
    strcat(*__s,*__s_00);
    marg[lVar3][iVar11][0] = '\0';
    iVar11 = iVar11 + -1;
  }
  goto LAB_0010d708;
}

Assistant:

int
macro_getargs(int ip)
{
	char *ptr;
	char  c, t;
	int   i, j, f, arg;
	int   level;

	/* can not nest too much macros */
	if (midx == 7) {
		error("Too many nested macro calls!");
		return (0);
	}

	/* initialize args */
	mcntstack[midx] = mcounter;
	mstack[midx++] = mlptr;
	ptr = marg[midx][0];
	arg = 0;

	for (i = 0; i < 9; i++)
		marg[midx][i][0] = '\0';

	/* extract args */
	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[ip]))
			ip++;

		c = prlnbuf[ip++];
		switch (c) {
		/* no arg */
		case ',':
			arg++;
			ptr = marg[midx][arg];
			if (arg == 9) {
				error("Too many arguments for a macro!");
				return (0);
			}
			break;

		/* string */
		case '{':
			c = '}';
		case '\"':
			i = 0;
			if (c == '\"')
				ptr[i++] = c;
			for (;;) {
				t = prlnbuf[ip++];
				if (t == '\0') {
					error("Unterminated string!");
					return (0);
				}
				if (i == 80) {
					error("String too long, max. 80 characters!");
					return (0);
				}
				if (t == c)
					break;
				ptr[i++] = t;
			}
			if (c == '\"')
				ptr[i++] = t;

			/* skip spaces */
			while (isspace(prlnbuf[ip]))
				ip++;

			/* check end of arg */
			switch (prlnbuf[ip]) {
			case '\0':
			case ',':
			case ';':
				break;

			default:
				error("Syntax error!");
				return (0);
			}

			/* end arg string */
			ptr[i] = '\0';
			break;

		/* end of line */
		case ';':
		case '\0':
			return (1);

		/* continuation char */
		case '\\':
			/* skip spaces */
			i = ip;
			while (isspace(prlnbuf[i]))
				i++;

			/* check */
			if (prlnbuf[i] == ';' || prlnbuf[i] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return (0);

				/* rewind line pointer and continue */
				ip = SFIELD;
				break;
			}

		/* other */
		default:
			i = 0;
			j = 0;
			f = 0;
			level = 0;
			while (c) {
				if (c == ',') {
					if (level == 0)
						break;
				}
				else if ((c == '(') || (c == '[')) {
					level++;
				}
				else if ((c == ')') || (c == ']')) {
					if (level)
						level--;
				}
				else if (c == ';') {
					break;
				}
				if (f) {
					if (c != ' ') {
						while (i < j)
							ptr[i++] = ' ';
						ptr[i++] = c;
						f = 0;
					}
				}
				else if (c == ' ') {
					f = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Macro argument string too long, max. 80 characters!");
					return (0);
				}
				j++;
				c = prlnbuf[ip++];
			}
			ptr[i] = '\0';
			ip--;

			/* check if arg is X or Y */
			if (strlen(ptr) && arg) {
				c = tolower(ptr[0]);

				if ((c == 'x') || (c == 'y')) {
					if ((strcasecmp(ptr, "x++") == 0) ||
						(strcasecmp(ptr, "y++") == 0) ||
						(strlen(ptr) == 1))
					{
						arg--;
						ptr = marg[midx][arg];

						/* check string length */
						if (strlen(ptr) > 75) {
							error("Macro argument string too long, max. 80 characters!");
							return (0);
						}

						/* attach current arg to the previous one */
						strcat(ptr, ",");
						strcat(ptr, marg[midx][arg + 1]);
						ptr = marg[midx][arg + 1];
						ptr[0] = '\0';
					}
			 	}
			}
			break;
		}
	}
}